

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

void cmd_cancel_repeat(void)

{
  uint32_t *puVar1;
  int iVar2;
  
  iVar2 = (cmd_tail + L'\x13') % 0x14;
  if ((cmd_queue[iVar2].nrepeats != 0) || (repeating == '\x01')) {
    cmd_queue[iVar2].nrepeats = 0;
    repeating = '\0';
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x8000;
  }
  return;
}

Assistant:

void cmd_cancel_repeat(void)
{
	struct command *cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];

	if (cmd->nrepeats || repeating) {
		/* Cancel */
		cmd->nrepeats = 0;
		repeating = false;

		/* Redraw the state (later) */
		player->upkeep->redraw |= (PR_STATE);
	}
}